

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlmanager.cpp
# Opt level: O1

void __thiscall mwheel::DLManager::load_library(DLManager *this,path *library_path)

{
  ostream *os;
  pointer pcVar1;
  void *pvVar2;
  char *__s;
  basic_ostream<char,_std::char_traits<char>_> *pbVar3;
  size_t sVar4;
  runtime_error *this_00;
  stringstream estream;
  string asStack_1d8 [32];
  undefined1 local_1b8 [32];
  void *local_198;
  
  pvVar2 = (void *)dlopen((library_path->m_pathname)._M_dataplus._M_p,1);
  __s = (char *)dlerror();
  if (__s == (char *)0x0) {
    pcVar1 = (library_path->m_pathname)._M_dataplus._M_p;
    local_1b8._0_8_ = local_1b8 + 0x10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_1b8,pcVar1,pcVar1 + (library_path->m_pathname)._M_string_length);
    local_198 = pvVar2;
    std::
    _Rb_tree<boost::filesystem::path,std::pair<boost::filesystem::path_const,void*>,std::_Select1st<std::pair<boost::filesystem::path_const,void*>>,std::less<boost::filesystem::path>,std::allocator<std::pair<boost::filesystem::path_const,void*>>>
    ::_M_emplace_unique<std::pair<boost::filesystem::path,void*>>
              ((_Rb_tree<boost::filesystem::path,std::pair<boost::filesystem::path_const,void*>,std::_Select1st<std::pair<boost::filesystem::path_const,void*>>,std::less<boost::filesystem::path>,std::allocator<std::pair<boost::filesystem::path_const,void*>>>
                *)this,(pair<boost::filesystem::path,_void_*> *)local_1b8);
    if ((undefined1 *)local_1b8._0_8_ != local_1b8 + 0x10) {
      operator_delete((void *)local_1b8._0_8_);
    }
    return;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
  os = (ostream *)(local_1b8 + 0x10);
  std::__ostream_insert<char,std::char_traits<char>>(os,"ERROR : cannot load shared library ",0x23);
  pbVar3 = boost::filesystem::operator<<
                     ((basic_ostream<char,_std::char_traits<char>_> *)os,library_path);
  std::endl<char,std::char_traits<char>>((ostream *)pbVar3);
  std::__ostream_insert<char,std::char_traits<char>>(os,"\t",1);
  sVar4 = strlen(__s);
  std::__ostream_insert<char,std::char_traits<char>>(os,__s,sVar4);
  std::endl<char,std::char_traits<char>>(os);
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(this_00,asStack_1d8);
  *(undefined ***)this_00 = &PTR__runtime_error_00106cd8;
  __cxa_throw(this_00,&error_loading_dynamic_library::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void DLManager::load_library(const boost::filesystem::path &library_path) {
#ifdef BOOST_OS_UNIX
  auto handle = dlopen(library_path.c_str(), RTLD_LAZY);
  auto error_message = dlerror();
  if (error_message) {
    stringstream estream;
    estream << "ERROR : cannot load shared library " << library_path << endl;
    estream << "\t" << error_message << endl;
    throw error_loading_dynamic_library(estream.str());
  }
  m_dl_map.insert(make_pair(library_path, handle));
#endif
}